

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDD::ChNodeFEAxyzDD(ChNodeFEAxyzDD *this,ChNodeFEAxyzDD *other)

{
  ChVariablesGenericDiagonalMass *this_00;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0x188);
  *(undefined ***)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       &PTR__ChLoadable_00b04a88;
  ChNodeFEAxyzD::ChNodeFEAxyzD
            (&this->super_ChNodeFEAxyzD,&PTR_construction_vtable_32__00b2e7e0,
             &other->super_ChNodeFEAxyzD);
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase._vptr_ChNodeFEAbase =
       (_func_int **)0xb2e388;
  *(undefined8 *)&this->field_0x188 = 0xb2e720;
  *(undefined8 *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChNodeFEAbase.field_0x18 =
       0xb2e580;
  (this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.super_ChVariableTupleCarrier_1vars<3>.
  _vptr_ChVariableTupleCarrier_1vars = (_func_int **)(vtable + 0x2e0);
  *(undefined8 *)&(this->super_ChNodeFEAxyzD).field_0x140 = 0;
  *(undefined8 *)&this->field_0x148 = 0;
  *(undefined8 *)&this->field_0x150 = 0;
  (this->DD_dt).m_data[0] = 0.0;
  (this->DD_dt).m_data[1] = 0.0;
  (this->DD_dt).m_data[2] = 0.0;
  (this->DD_dtdt).m_data[0] = 0.0;
  (this->DD_dtdt).m_data[1] = 0.0;
  (this->DD_dtdt).m_data[2] = 0.0;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,3);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAxyzD).field_0x138 = this_00;
  ChVariablesGenericDiagonalMass::operator=
            (this_00,*(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAxyzD).field_0x138);
  if (other != this) {
    *(undefined8 *)&(this->super_ChNodeFEAxyzD).field_0x140 =
         *(undefined8 *)&(other->super_ChNodeFEAxyzD).field_0x140;
    *(undefined8 *)&this->field_0x148 = *(undefined8 *)&other->field_0x148;
    *(undefined8 *)&this->field_0x150 = *(undefined8 *)&other->field_0x150;
    (this->DD_dt).m_data[0] = (other->DD_dt).m_data[0];
    (this->DD_dt).m_data[1] = (other->DD_dt).m_data[1];
    (this->DD_dt).m_data[2] = (other->DD_dt).m_data[2];
    (this->DD_dtdt).m_data[0] = (other->DD_dtdt).m_data[0];
    (this->DD_dtdt).m_data[1] = (other->DD_dtdt).m_data[1];
    (this->DD_dtdt).m_data[2] = (other->DD_dtdt).m_data[2];
  }
  return;
}

Assistant:

ChNodeFEAxyzDD::ChNodeFEAxyzDD(const ChNodeFEAxyzDD& other) : ChNodeFEAxyzD(other) {
    variables_DD = new ChVariablesGenericDiagonalMass(3);
    (*variables_DD) = (*other.variables_DD);
    DD = other.DD;
    DD_dt = other.DD_dt;
    DD_dtdt = other.DD_dtdt;
}